

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void calc_frm_crc(MppFrame frame,FrmCrc *crc)

{
  undefined1 auVar1 [16];
  RK_U32 len;
  uint uVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  undefined8 uVar6;
  long lVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  
  len = mpp_frame_get_width();
  uVar2 = mpp_frame_get_height(frame);
  iVar3 = mpp_frame_get_hor_stride(frame);
  uVar6 = mpp_frame_get_buffer(frame);
  lVar7 = mpp_buffer_get_ptr_with_caller(uVar6,"calc_frm_crc");
  uVar10 = 0;
  auVar1 = (ZEXT816(0) << 0x40 | ZEXT816(0x400000004)) / ZEXT416(len + 3 & 0xfffffffc);
  uVar8 = auVar1._0_8_;
  iVar4 = auVar1._0_4_;
  (crc->luma).sum_cnt = (RK_U32)((ulong)((iVar4 + uVar2) - 1) / (uVar8 & 0xffffffff));
  iVar9 = (int)((ulong)uVar2 % (uVar8 & 0xffffffff));
  uVar13 = uVar2 - iVar9;
  if (uVar13 != 0) {
    uVar11 = 0;
    do {
      wide_bit_sum((RK_U8 *)(uVar10 + lVar7),len,
                   (crc->luma).sum + (uVar11 & 0xffffffff) / (uVar8 & 0xffffffff));
      uVar11 = uVar11 + 1;
      uVar10 = (ulong)(uint)((int)uVar10 + iVar3);
    } while (uVar11 < uVar13);
  }
  if (iVar9 != 0) {
    do {
      wide_bit_sum((RK_U8 *)((ulong)(uVar13 * iVar3) + lVar7),len,
                   (crc->luma).sum + (ulong)uVar13 / (uVar8 & 0xffffffff));
      uVar13 = uVar13 + 1;
    } while (uVar13 < uVar2);
  }
  if (uVar2 == 0) {
    uVar13 = 0;
  }
  else {
    uVar10 = 0;
    uVar11 = 0;
    uVar13 = 0;
    do {
      if (3 < len) {
        uVar12 = 0;
        do {
          uVar13 = uVar13 ^ *(uint *)(uVar10 + lVar7 + uVar12 * 4);
          uVar12 = uVar12 + 1;
        } while (len >> 2 != uVar12);
      }
      uVar11 = uVar11 + 1;
      uVar10 = (ulong)(uint)((int)uVar10 + iVar3);
    } while (uVar11 != uVar2);
  }
  (crc->luma).len = uVar2 * len;
  (crc->luma).vor = uVar13;
  uVar5 = uVar2 >> 1;
  uVar10 = (ulong)uVar5;
  uVar11 = 0;
  (crc->chroma).sum_cnt = (RK_U32)((ulong)((uVar5 + iVar4) - 1) / (uVar8 & 0xffffffff));
  lVar7 = lVar7 + (ulong)(uVar2 * iVar3);
  iVar4 = (int)(uVar10 % (uVar8 & 0xffffffff));
  uVar5 = uVar5 - iVar4;
  if (uVar5 != 0) {
    uVar12 = 0;
    do {
      wide_bit_sum((RK_U8 *)(uVar11 + lVar7),len,
                   (crc->chroma).sum + (uVar12 & 0xffffffff) / (uVar8 & 0xffffffff));
      uVar12 = uVar12 + 1;
      uVar11 = (ulong)(uint)((int)uVar11 + iVar3);
    } while (uVar12 < uVar5);
  }
  if (iVar4 != 0) {
    uVar11 = uVar10 - uVar10 % (uVar8 & 0xffffffff);
    do {
      wide_bit_sum((RK_U8 *)((ulong)(uint)(iVar3 * (int)uVar11) + lVar7),len,
                   (crc->chroma).sum + (uVar11 & 0xffffffff) / (uVar8 & 0xffffffff));
      uVar11 = uVar11 + 1;
    } while (uVar11 < uVar10);
  }
  if (1 < uVar2) {
    uVar8 = 0;
    uVar11 = 0;
    do {
      if (3 < len) {
        uVar12 = 0;
        do {
          uVar13 = uVar13 ^ *(uint *)(uVar8 + lVar7 + uVar12 * 4);
          uVar12 = uVar12 + 1;
        } while (len >> 2 != uVar12);
      }
      uVar11 = uVar11 + 1;
      uVar8 = (ulong)(uint)((int)uVar8 + iVar3);
    } while (uVar11 != uVar10);
  }
  (crc->chroma).len = uVar2 * len >> 1;
  (crc->chroma).vor = uVar13;
  return;
}

Assistant:

void calc_frm_crc(MppFrame frame, FrmCrc *crc)
{
    RK_ULONG data_grp_byte_cnt = MAX_HALF_WORD_SUM_CNT * CAL_BYTE;
    RK_U32 grp_line_cnt = 0;
    RK_U32 grp_cnt = 0;

    RK_U32 y = 0, x = 0;
    RK_U8 *dat8 = NULL;
    RK_U32 *dat32 = NULL;
    RK_U32 xor = 0;

    RK_U32 width  = mpp_frame_get_width(frame);
    RK_U32 height = mpp_frame_get_height(frame);
    RK_U32 stride = mpp_frame_get_hor_stride(frame);
    RK_U8 *buf = (RK_U8 *)mpp_buffer_get_ptr(mpp_frame_get_buffer(frame));

    grp_line_cnt = data_grp_byte_cnt / ((width + CAL_BYTE - 1) / CAL_BYTE * CAL_BYTE);

    /* luma */
    grp_cnt = (height + grp_line_cnt - 1) / grp_line_cnt;
    crc->luma.sum_cnt = grp_cnt;

    dat8 = buf;
    for (y = 0; y <  height / grp_line_cnt * grp_line_cnt; y++) {
        wide_bit_sum(&dat8[y * stride], width, &crc->luma.sum[y / grp_line_cnt]);
    }
    if (height % grp_line_cnt) {
        for (y = height / grp_line_cnt * grp_line_cnt; y < height; y++) {
            wide_bit_sum(&dat8[y * stride], width, &crc->luma.sum[y / grp_line_cnt]);
        }
    }

    dat8 = buf;
    for (y = 0; y < height; y++) {
        dat32 = (RK_U32 *)&dat8[y * stride];
        for (x = 0; x < width / 4; x++)
            xor ^= dat32[x];
    }
    crc->luma.len = height * width;
    crc->luma.vor = xor;

    /* chroma */
    grp_cnt = (height / 2 + grp_line_cnt - 1) / grp_line_cnt;
    crc->chroma.sum_cnt = grp_cnt;

    dat8 = buf + height * stride;
    for (y = 0; y <  height / 2 / grp_line_cnt * grp_line_cnt; y++) {
        wide_bit_sum(&dat8[y * stride], width, &crc->chroma.sum[y / grp_line_cnt]);
    }
    if (height / 2 % grp_line_cnt) {
        for (y = height / 2 / grp_line_cnt * grp_line_cnt; y < height / 2; y++) {
            wide_bit_sum(&dat8[y * stride], width, &crc->chroma.sum[y / grp_line_cnt]);
        }
    }

    dat8 = buf + height * stride;
    for (y = 0; y < height / 2; y++) {
        dat32 = (RK_U32 *)&dat8[y * stride];
        for (x = 0; x < width / 4; x++)
            xor ^= dat32[x];
    }
    crc->chroma.len = height * width / 2;
    crc->chroma.vor = xor;
}